

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

void auto_arima_setStationarityParameters(auto_arima_object obj,char *test,double alpha,char *type)

{
  int iVar1;
  char *__s;
  
  iVar1 = strcmp(test,"kpss");
  if (iVar1 != 0) {
    if (*test == 'd') {
      if (test[1] == 'f') goto LAB_00112091;
    }
    else if ((*test == 'p') && (test[1] == 'p')) {
LAB_00112091:
      if (test[2] == '\0') goto LAB_001120ab;
    }
    iVar1 = strcmp(test,"adf");
    if (iVar1 != 0) {
      __s = "Only three tests are allowed - kpss, df and pp ";
      goto LAB_00112117;
    }
  }
LAB_001120ab:
  strcpy(obj->test,test);
  iVar1 = strcmp(type,"level");
  if ((iVar1 == 0) || (iVar1 = strcmp(type,"trend"), iVar1 == 0)) {
    strcpy(obj->type,type);
    obj->alpha_test = alpha;
    return;
  }
  __s = "Only two tests are allowed - level and trend ";
LAB_00112117:
  puts(__s);
  exit(-1);
}

Assistant:

void auto_arima_setStationarityParameters(auto_arima_object obj,const char *test, double alpha, const char *type) {
	if (!strcmp(test,"kpss") || !strcmp(test,"pp") || !strcmp(test,"df") || !strcmp(test,"adf")) {
		strcpy(obj->test,test);
	} else {
		printf("Only three tests are allowed - kpss, df and pp \n");
		exit(-1);
	}

	if (!strcmp(type,"level") || !strcmp(type,"trend")) {
		strcpy(obj->type,type);
	} else {
		printf("Only two tests are allowed - level and trend \n");
		exit(-1);
	}

	obj->alpha_test = alpha;
}